

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VertexMCMC.h
# Opt level: O3

Estimates * VertexMCMC(Estimates *__return_storage_ptr__,CGraph *cg,Parameters *params)

{
  EdgeIdx *pEVar1;
  long lVar2;
  size_type __n;
  EdgeIdx EVar3;
  uint uVar4;
  ulong uVar5;
  result_type rVar6;
  ulong uVar7;
  result_type rVar8;
  ulong uVar9;
  size_t __i;
  long lVar10;
  size_type sVar11;
  ulong uVar12;
  long lVar13;
  ulong *puVar14;
  int iVar15;
  unsigned_long uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  double dVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  double dVar23;
  vector<OrderedEdge,_std::allocator<OrderedEdge>_> edge_list;
  uniform_int_distribution<long> dist_parent_nbor;
  uniform_int_distribution<long> dist_nbor;
  mt19937 mt;
  random_device rd;
  undefined4 uStack_3cc4;
  undefined4 uStack_3cc0;
  double local_3cb8;
  double local_3cb0;
  undefined1 local_3c98 [16];
  OrderedEdge *local_3c88;
  Parameters *local_3c80;
  vector<bool,_std::allocator<bool>_> local_3c78;
  vector<bool,_std::allocator<bool>_> local_3c50;
  long local_3c28;
  ulong local_3c20;
  size_type local_3c18;
  ulong local_3c10;
  Estimates local_3c08;
  OrderedEdgeCollection local_3be8;
  Parameters local_3b70;
  undefined1 local_3ac8 [16];
  ulong local_3ab8;
  unsigned_long uStack_3ab0;
  vector<bool,_std::allocator<bool>_> local_3aa8;
  vector<bool,_std::allocator<bool>_> local_3a80;
  unsigned_long local_3a58;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_2740;
  random_device local_13b8;
  
  __n = cg->nVertices;
  EVar3 = cg->nEdges;
  uVar19 = params->walk_length;
  uVar5 = *(params->seed_vertices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_3c80 = params;
  std::random_device::random_device(&local_13b8);
  uVar4 = std::random_device::_M_getval();
  local_2740._M_x[0] = (unsigned_long)uVar4;
  lVar10 = 1;
  uVar17 = local_2740._M_x[0];
  do {
    uVar17 = (ulong)(((uint)(uVar17 >> 0x1e) ^ (uint)uVar17) * 0x6c078965 + (int)lVar10);
    local_2740._M_x[lVar10] = uVar17;
    lVar10 = lVar10 + 1;
  } while (lVar10 != 0x270);
  local_2740._M_p = 0x270;
  local_3c98 = (undefined1  [16])0x0;
  local_3c88 = (OrderedEdge *)0x0;
  local_3ac8._0_8_ = local_3ac8._0_8_ & 0xffffffffffffff00;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_3c50,__n,(bool *)local_3ac8,(allocator_type *)&local_3c78);
  local_3ac8._0_8_ = local_3ac8._0_8_ & 0xffffffffffffff00;
  uStack_3cc4 = (undefined4)(__n >> 0x20);
  uStack_3cc0 = (undefined4)EVar3;
  local_3c18 = CONCAT44(uStack_3cc4,uStack_3cc0);
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_3c78,local_3c18,(bool *)local_3ac8,(allocator_type *)&local_3c08);
  if (cg->offsets[uVar5 + 1] == cg->offsets[uVar5]) {
    memcpy((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            *)local_3ac8,&local_2740,5000);
    local_3c08.fraction_of_vertices_seen = (double)(cg->nVertices + -1);
    local_3c08.estimate = 0.0;
    uVar4 = 0;
    do {
      printf("BAd luck! Trying again %d\n",(ulong)uVar4);
      uVar5 = std::uniform_int_distribution<long>::operator()
                        ((uniform_int_distribution<long> *)&local_3c08,
                         (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                          *)local_3ac8,(param_type *)&local_3c08);
      if (0x3e6 < uVar4) break;
      uVar4 = uVar4 + 1;
    } while (cg->offsets[uVar5 + 1] == cg->offsets[uVar5]);
  }
  if ((long)uVar19 < 1) {
    local_3cb8 = 0.0;
    local_3cb0 = 0.0;
  }
  else {
    local_3c28 = uVar19 * 4;
    lVar10 = 0;
    local_3c20 = uVar19;
    do {
      pEVar1 = cg->offsets;
      uVar16 = pEVar1[uVar5 + 1] - pEVar1[uVar5];
      lVar2 = uVar16 - 1;
      local_3c08.estimate = 0.0;
      lVar13 = pEVar1[uVar5];
      local_3c10 = uVar19;
      local_3c08.fraction_of_vertices_seen = (double)lVar2;
      rVar6 = std::uniform_int_distribution<long>::operator()
                        ((uniform_int_distribution<long> *)&local_3c08,&local_2740,
                         (param_type *)&local_3c08);
      uVar17 = rVar6 + lVar13;
      uVar19 = cg->nbors[uVar17];
      lVar13 = cg->offsets[uVar19 + 1] - cg->offsets[uVar19];
      local_3ac8._8_8_ = uVar19;
      local_3ac8._0_8_ = uVar5;
      local_3ab8 = uVar17;
      uStack_3ab0 = uVar16;
      if ((OrderedEdge *)local_3c98._8_8_ == local_3c88) {
        std::vector<OrderedEdge,_std::allocator<OrderedEdge>_>::_M_realloc_insert<OrderedEdge>
                  ((vector<OrderedEdge,_std::allocator<OrderedEdge>_> *)local_3c98,
                   (iterator)local_3c98._8_8_,(OrderedEdge *)local_3ac8);
      }
      else {
        *(ulong *)(local_3c98._8_8_ + 0x10) = uVar17;
        *(unsigned_long *)(local_3c98._8_8_ + 0x18) = uVar16;
        *(VertexIdx *)local_3c98._8_8_ = uVar5;
        *(ulong *)(local_3c98._8_8_ + 8) = uVar19;
        local_3c98._8_8_ = (OrderedEdge *)(local_3c98._8_8_ + 0x20);
      }
      uVar7 = uVar5 + 0x3f;
      if (-1 < (long)uVar5) {
        uVar7 = uVar5;
      }
      local_3c50.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_p
      [((long)uVar7 >> 6) + ((ulong)((uVar5 & 0x800000000000003f) < 0x8000000000000001) - 1)] =
           local_3c50.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p
           [((long)uVar7 >> 6) + ((ulong)((uVar5 & 0x800000000000003f) < 0x8000000000000001) - 1)] |
           1L << ((byte)uVar5 & 0x3f);
      uVar7 = uVar19 + 0x3f;
      if (-1 < (long)uVar19) {
        uVar7 = uVar19;
      }
      local_3c50.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_p
      [((long)uVar7 >> 6) + ((ulong)((uVar19 & 0x800000000000003f) < 0x8000000000000001) - 1)] =
           local_3c50.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p
           [((long)uVar7 >> 6) + ((ulong)((uVar19 & 0x800000000000003f) < 0x8000000000000001) - 1)]
           | 1L << ((byte)uVar19 & 0x3f);
      uVar7 = uVar17 + 0x3f;
      if (-1 < (long)uVar17) {
        uVar7 = uVar17;
      }
      local_3c78.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_p
      [((long)uVar7 >> 6) + ((ulong)((uVar17 & 0x800000000000003f) < 0x8000000000000001) - 1)] =
           local_3c78.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p
           [((long)uVar7 >> 6) + ((ulong)((uVar17 & 0x800000000000003f) < 0x8000000000000001) - 1)]
           | 1L << ((byte)uVar17 & 0x3f);
      if (uVar16 == 1) {
        local_3ac8._8_8_ = (void *)(lVar13 + -1);
      }
      else {
        dVar23 = std::
                 generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                           (&local_2740);
        local_3ac8._8_8_ = lVar13 + -1;
        if ((double)(long)local_3ac8._8_8_ / (double)lVar2 <= dVar23) {
          local_3ac8._8_8_ = lVar2;
          uVar19 = uVar5;
        }
      }
      uVar5 = uVar19;
      local_3ac8._0_8_ = 0;
      lVar13 = cg->offsets[uVar5];
      rVar6 = std::uniform_int_distribution<long>::operator()
                        ((uniform_int_distribution<long> *)local_3ac8,&local_2740,
                         (param_type *)local_3ac8);
      lVar2 = cg->offsets[uVar5];
      rVar8 = std::uniform_int_distribution<long>::operator()
                        ((uniform_int_distribution<long> *)local_3ac8,&local_2740,
                         (param_type *)local_3ac8);
      uVar18 = rVar6 + lVar13;
      uVar12 = rVar8 + lVar2;
      uVar19 = cg->nbors[uVar18];
      uVar17 = cg->nbors[uVar12];
      uVar9 = Escape::CGraph::getEdgeBinary(cg,uVar19,uVar17);
      uVar7 = uVar19 + 0x3f;
      if (-1 < (long)uVar19) {
        uVar7 = uVar19;
      }
      local_3c50.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_p
      [((long)uVar7 >> 6) + ((ulong)((uVar19 & 0x800000000000003f) < 0x8000000000000001) - 1)] =
           local_3c50.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p
           [((long)uVar7 >> 6) + ((ulong)((uVar19 & 0x800000000000003f) < 0x8000000000000001) - 1)]
           | 1L << ((byte)uVar19 & 0x3f);
      uVar7 = uVar17 + 0x3f;
      if (-1 < (long)uVar17) {
        uVar7 = uVar17;
      }
      local_3c50.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_p
      [((long)uVar7 >> 6) + ((ulong)((uVar17 & 0x800000000000003f) < 0x8000000000000001) - 1)] =
           local_3c50.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p
           [((long)uVar7 >> 6) + ((ulong)((uVar17 & 0x800000000000003f) < 0x8000000000000001) - 1)]
           | 1L << ((byte)uVar17 & 0x3f);
      uVar7 = uVar18 + 0x3f;
      if (-1 < (long)uVar18) {
        uVar7 = uVar18;
      }
      local_3c78.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_p
      [((long)uVar7 >> 6) + ((ulong)((uVar18 & 0x800000000000003f) < 0x8000000000000001) - 1)] =
           local_3c78.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p
           [((long)uVar7 >> 6) + ((ulong)((uVar18 & 0x800000000000003f) < 0x8000000000000001) - 1)]
           | 1L << ((byte)uVar18 & 0x3f);
      uVar7 = uVar12 + 0x3f;
      if (-1 < (long)uVar12) {
        uVar7 = uVar12;
      }
      local_3c78.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_p
      [((long)uVar7 >> 6) + ((ulong)((uVar12 & 0x800000000000003f) < 0x8000000000000001) - 1)] =
           local_3c78.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p
           [((long)uVar7 >> 6) + ((ulong)((uVar12 & 0x800000000000003f) < 0x8000000000000001) - 1)]
           | 1L << ((byte)uVar12 & 0x3f);
      if (uVar9 != 0xffffffffffffffff) {
        uVar7 = uVar9 + 0x3f;
        if (-1 < (long)uVar9) {
          uVar7 = uVar9;
        }
        local_3c78.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p
        [((long)uVar7 >> 6) + ((ulong)((uVar9 & 0x800000000000003f) < 0x8000000000000001) - 1)] =
             local_3c78.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_p
             [((long)uVar7 >> 6) + ((ulong)((uVar9 & 0x800000000000003f) < 0x8000000000000001) - 1)]
             | 1L << ((byte)uVar9 & 0x3f);
      }
      lVar10 = lVar10 + (ulong)(uVar19 != uVar17 && uVar9 != 0xffffffffffffffff);
      uVar19 = local_3c10 - 1;
    } while (uVar19 != 0);
    local_3cb0 = (double)lVar10;
    local_3cb8 = (double)local_3c28 * 100.0;
    uVar19 = local_3c20;
  }
  if (local_3c80->normalization_count_available == true) {
    if ((long)__n < 1) {
      dVar23 = 0.0;
    }
    else {
      dVar23 = 0.0;
      sVar11 = 0;
      do {
        lVar10 = cg->offsets[sVar11 + 1] - cg->offsets[sVar11];
        dVar23 = dVar23 + (double)((lVar10 + -1) * lVar10) * 0.5;
        sVar11 = sVar11 + 1;
      } while (__n != sVar11);
    }
  }
  else {
    local_3ac8._0_8_ = uVar19;
    std::vector<OrderedEdge,_std::allocator<OrderedEdge>_>::vector
              ((vector<OrderedEdge,_std::allocator<OrderedEdge>_> *)(local_3ac8 + 8),
               (vector<OrderedEdge,_std::allocator<OrderedEdge>_> *)local_3c98);
    std::vector<bool,_std::allocator<bool>_>::vector(&local_3aa8,&local_3c78);
    std::vector<bool,_std::allocator<bool>_>::vector(&local_3a80,&local_3c50);
    local_3a58 = 0;
    local_3be8.no_of_edges = local_3ac8._0_8_;
    std::vector<OrderedEdge,_std::allocator<OrderedEdge>_>::vector
              (&local_3be8.edge_list,
               (vector<OrderedEdge,_std::allocator<OrderedEdge>_> *)(local_3ac8 + 8));
    std::vector<bool,_std::allocator<bool>_>::vector(&local_3be8.visited_edge_set,&local_3aa8);
    std::vector<bool,_std::allocator<bool>_>::vector(&local_3be8.visited_vertex_set,&local_3a80);
    local_3be8.no_of_query = local_3a58;
    Parameters::Parameters(&local_3b70,local_3c80);
    DegreeSumSquare(&local_3c08,cg,&local_3be8,&local_3b70,0x19);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b70.out_directory._M_dataplus._M_p != &local_3b70.out_directory.field_2) {
      operator_delete(local_3b70.out_directory._M_dataplus._M_p,
                      local_3b70.out_directory.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b70.algo_name._M_dataplus._M_p != &local_3b70.algo_name.field_2) {
      operator_delete(local_3b70.algo_name._M_dataplus._M_p,
                      local_3b70.algo_name.field_2._M_allocated_capacity + 1);
    }
    if (local_3b70.seed_vertices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_3b70.seed_vertices.super__Vector_base<long,_std::allocator<long>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_3b70.seed_vertices.super__Vector_base<long,_std::allocator<long>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_3b70.seed_vertices.super__Vector_base<long,_std::allocator<long>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b70.filename._M_dataplus._M_p != &local_3b70.filename.field_2) {
      operator_delete(local_3b70.filename._M_dataplus._M_p,
                      local_3b70.filename.field_2._M_allocated_capacity + 1);
    }
    if (local_3be8.visited_vertex_set.super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
      operator_delete(local_3be8.visited_vertex_set.super__Bvector_base<std::allocator<bool>_>.
                      _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                      (long)local_3be8.visited_vertex_set.super__Bvector_base<std::allocator<bool>_>
                            ._M_impl.super__Bvector_impl_data._M_end_of_storage -
                      (long)local_3be8.visited_vertex_set.super__Bvector_base<std::allocator<bool>_>
                            ._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                     );
      local_3be8.visited_vertex_set.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_3be8.visited_vertex_set.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
      local_3be8.visited_vertex_set.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_3be8.visited_vertex_set.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
      local_3be8.visited_vertex_set.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
    }
    if (local_3be8.visited_edge_set.super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
      operator_delete(local_3be8.visited_edge_set.super__Bvector_base<std::allocator<bool>_>._M_impl
                      .super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                      (long)local_3be8.visited_edge_set.super__Bvector_base<std::allocator<bool>_>.
                            _M_impl.super__Bvector_impl_data._M_end_of_storage -
                      (long)local_3be8.visited_edge_set.super__Bvector_base<std::allocator<bool>_>.
                            _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p)
      ;
      local_3be8.visited_edge_set.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_3be8.visited_edge_set.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
      local_3be8.visited_edge_set.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_3be8.visited_edge_set.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
      local_3be8.visited_edge_set.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
    }
    if (local_3be8.edge_list.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_3be8.edge_list.
                      super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_3be8.edge_list.
                            super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_3be8.edge_list.
                            super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    dVar23 = local_3c08.estimate;
    if (local_3a80.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
      operator_delete(local_3a80.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                      (long)local_3a80.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_end_of_storage -
                      (long)local_3a80.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
      local_3a80.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_3a80.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_offset = 0;
      local_3a80.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_3a80.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_offset = 0;
      local_3a80.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_end_of_storage = (_Bit_pointer)0x0;
    }
    if (local_3aa8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
      operator_delete(local_3aa8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                      (long)local_3aa8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_end_of_storage -
                      (long)local_3aa8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
      local_3aa8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_3aa8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_offset = 0;
      local_3aa8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_3aa8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_offset = 0;
      local_3aa8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_end_of_storage = (_Bit_pointer)0x0;
    }
    if ((void *)local_3ac8._8_8_ != (void *)0x0) {
      operator_delete((void *)local_3ac8._8_8_,uStack_3ab0 - local_3ac8._8_8_);
    }
  }
  __return_storage_ptr__->estimate = ((local_3cb0 / (double)(long)uVar19) * dVar23) / 3.0;
  dVar20 = 0.0;
  dVar23 = 0.0;
  if (local_3c78.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_offset != 0 ||
      local_3c78.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_p !=
      local_3c78.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_p) {
    lVar10 = 0;
    uVar19 = 0;
    puVar14 = local_3c78.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
              ._M_start.super__Bit_iterator_base._M_p;
    do {
      lVar10 = lVar10 + (ulong)((*puVar14 >> (uVar19 & 0x3f) & 1) != 0);
      iVar15 = (int)uVar19;
      puVar14 = puVar14 + (iVar15 == 0x3f);
      uVar19 = (ulong)(iVar15 + 1);
      if (iVar15 == 0x3f) {
        uVar19 = 0;
      }
    } while ((uint)uVar19 !=
             local_3c78.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_offset ||
             puVar14 !=
             local_3c78.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_p);
    dVar23 = (double)lVar10 * 100.0;
  }
  if (local_3c50.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_offset != 0 ||
      local_3c50.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_p !=
      local_3c50.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_p) {
    lVar10 = 0;
    uVar19 = 0;
    puVar14 = local_3c50.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
              ._M_start.super__Bit_iterator_base._M_p;
    do {
      lVar10 = lVar10 + (ulong)((*puVar14 >> (uVar19 & 0x3f) & 1) != 0);
      iVar15 = (int)uVar19;
      puVar14 = puVar14 + (iVar15 == 0x3f);
      uVar19 = (ulong)(iVar15 + 1);
      if (iVar15 == 0x3f) {
        uVar19 = 0;
      }
    } while ((uint)uVar19 !=
             local_3c50.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_offset ||
             puVar14 !=
             local_3c50.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_p);
    dVar20 = (double)lVar10 * 100.0;
  }
  auVar21._8_8_ = dVar23;
  auVar21._0_8_ = dVar20;
  dVar23 = (double)(long)local_3c18;
  auVar22._8_4_ = SUB84(dVar23,0);
  auVar22._0_8_ = (double)(long)__n;
  auVar22._12_4_ = (int)((ulong)dVar23 >> 0x20);
  auVar22 = divpd(auVar21,auVar22);
  __return_storage_ptr__->fraction_of_vertices_seen = (double)auVar22._0_8_;
  __return_storage_ptr__->fraction_of_edges_seen = (double)auVar22._8_8_;
  __return_storage_ptr__->query_complexity = local_3cb8 / dVar23;
  if (local_3c78.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_p != (ulong *)0x0) {
    operator_delete(local_3c78.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_3c78.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_3c78.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  if (local_3c50.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_p != (ulong *)0x0) {
    operator_delete(local_3c50.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_3c50.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_3c50.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  if ((pointer)local_3c98._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_3c98._0_8_,(long)local_3c88 - local_3c98._0_8_);
  }
  std::random_device::_M_fini();
  return __return_storage_ptr__;
}

Assistant:

Estimates VertexMCMC(CGraph *cg, Parameters params)
{
    /**
     * Setting of various input parameters for executing the algorithm
     */
    VertexIdx n = cg->nVertices;
    EdgeIdx m = cg->nEdges; // Note that m is double of the number of edges in the graph
    // VertexIdx seed_count = params.seed_count;  // Unused for now. Reserved for future use
    EdgeIdx walk_length = params.walk_length;
    VertexIdx seed = params.seed_vertices[0]; // We are working with only one seed vertex for this project

    /**
    * Set up random number generator
    * Using this random number generator initializize a PRNG: this PRNG is passed along to
    * draw an element from various distributions
    */
    std::random_device rd;
    std::mt19937 mt(rd());

    /**
     * Data structures for book-keeping and local variables
     */
    std::vector<OrderedEdge> edge_list;
    std::vector <bool > visited_vertex_set(n,false);
    std::vector <bool > visited_edge_set(m,false);
    EdgeIdx count_tri = 0; // This variable counts the number of times we find a triangle
    VertexIdx no_of_query = 0;  // Counts the number of query made by the algorithm
    VertexIdx parent, child,deg_of_parent, deg_of_child;

    /**
     * Algorithm
     */
    parent = seed;
    deg_of_parent = cg->degree(parent); // degree of parent vertex
    if (deg_of_parent == 0)  // If we are stuck with an isolate vertex, we change the seed
        parent = AlternateSeed(cg,mt);

    for (EdgeIdx wL = 0; wL < walk_length; wL++) {  // Perform a random walk of length walk_length from the seed vertex
        deg_of_parent = cg->degree(parent); // degree of parent vertex
        std::uniform_int_distribution<VertexIdx> dist_parent_nbor(0, deg_of_parent - 1);
        EdgeIdx random_nbor_edge = cg->offsets[parent] + dist_parent_nbor(mt); // TODO: check randomness. same seeding ok?
        no_of_query++; // One query to the uniform random neighbor oracle
        child = cg->nbors[random_nbor_edge]; // child is the potential next vertex on the random walk
        deg_of_child = cg->degree(child);// degree of the child vertex

        /**
         * Update data structures
         */
        edge_list.push_back(OrderedEdge{parent, child, random_nbor_edge, deg_of_parent}); // Note that we do not care of the ordering of the edge.
        visited_vertex_set[parent] = true;
        visited_vertex_set[child] = true;
        visited_edge_set[random_nbor_edge] = true;

        /**
         * Decide if to take the step or stay put at the same vertex
         */
        bool accept;
        double acceptance_prob;
        if (deg_of_parent == 1)
            accept = true;
        else {
            acceptance_prob = (deg_of_child - 1) * 1.0 / (deg_of_parent - 1);
            std::bernoulli_distribution accpet_dist(acceptance_prob);
            accept = accpet_dist(mt);
        }
        if (accept) {
            parent = child;
            deg_of_parent = deg_of_child;
        }

        /**
         * Sample two nodes from the the neighborhood of parent. Call them u and v. Check if they form a triangle
         */
        std::uniform_int_distribution<VertexIdx> dist_nbor(0, deg_of_parent - 1);
        EdgeIdx random_nbor_edge_u = cg->offsets[parent] + dist_nbor(mt); // TODO: check randomness. same seeding ok?
        EdgeIdx random_nbor_edge_v = cg->offsets[parent] + dist_nbor(mt);
        no_of_query = no_of_query + 2; // Two queries to the uniform random neighbor oracle
        VertexIdx u = cg->nbors[random_nbor_edge_u];
        VertexIdx v = cg->nbors[random_nbor_edge_v];
        EdgeIdx e = cg->getEdgeBinary(u,v);
        no_of_query++; // One query to the edge oracle
        if( u!=v && e != -1) {// parent,u,v forms a triangle
            count_tri++;
        }

        /**
         * Update data structures
         */
        visited_vertex_set[u] = true;
        visited_vertex_set[v] = true;
        visited_edge_set[random_nbor_edge_u] = true;
        visited_edge_set[random_nbor_edge_v] = true;
        if (e!= -1)
            visited_edge_set[e] =true;

    }

    /**
     * Estimate the number of wedge count. This will be used in the triangle estimation.
     */
    double wedge_count = 0;
    if (!params.normalization_count_available) {
        int skip = 25;
        OrderedEdgeCollection randomEdgeCollection = {walk_length, edge_list, visited_edge_set, visited_vertex_set};
        Estimates degree_sum_sq_output = DegreeSumSquare(cg, randomEdgeCollection, params, skip);
        wedge_count = degree_sum_sq_output.estimate;
    }
    else {
        for (VertexIdx src=0; src < n; src++) {
            VertexIdx deg = cg->degree(src);
            wedge_count += deg * (deg-1) * 0.5;
        }
    }

    double transitivity = 1.0*count_tri / walk_length;
    double triangleEstimate = transitivity * wedge_count / 3.0 ;

    /**
     * Populate the return structure
     */
    Estimates return_estimate = {};
    return_estimate.estimate = triangleEstimate;

    VertexIdx edges_seen = std::count(visited_edge_set.begin(),visited_edge_set.end(),true);
    VertexIdx vertices_seen = std::count(visited_vertex_set.begin(),visited_vertex_set.end(), true);

    return_estimate.fraction_of_vertices_seen = vertices_seen * 100.0 / n;
    return_estimate.fraction_of_edges_seen = edges_seen * 100.0 / m;
    return_estimate.query_complexity = no_of_query *100.0 /m;

    return return_estimate;
}